

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O1

S2Polyline * __thiscall S2Polyline::operator=(S2Polyline *this,S2Polyline *other)

{
  int iVar1;
  Vector3<double> *pVVar2;
  Vector3<double> *pVVar3;
  
  this->s2debug_override_ = other->s2debug_override_;
  iVar1 = other->num_vertices_;
  other->num_vertices_ = 0;
  this->num_vertices_ = iVar1;
  pVVar2 = (other->vertices_)._M_t.
           super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
           super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
           super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl;
  (other->vertices_)._M_t.
  super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
  super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl = (Vector3<double> *)0x0;
  pVVar3 = (this->vertices_)._M_t.
           super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
           super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
           super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl;
  (this->vertices_)._M_t.
  super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
  super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl = pVVar2;
  if (pVVar3 != (Vector3<double> *)0x0) {
    operator_delete__(pVVar3);
  }
  return this;
}

Assistant:

S2Polyline& S2Polyline::operator=(S2Polyline&& other) {
  s2debug_override_ = other.s2debug_override_;
  num_vertices_ = absl::exchange(other.num_vertices_, 0);
  vertices_ = std::move(other.vertices_);
  return *this;
}